

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void field(LexState *ls,ConsControl *cc)

{
  int iVar1;
  ConsControl *cc_local;
  LexState *ls_local;
  
  iVar1 = (ls->t).token;
  if (iVar1 == 0x5b) {
    recfield(ls,cc);
  }
  else if (iVar1 == 0x124) {
    iVar1 = luaX_lookahead(ls);
    if (iVar1 == 0x3d) {
      recfield(ls,cc);
    }
    else {
      listfield(ls,cc);
    }
  }
  else {
    listfield(ls,cc);
  }
  return;
}

Assistant:

static void field (LexState *ls, struct ConsControl *cc) {
  /* field -> listfield | recfield */
  switch(ls->t.token) {
    case TK_NAME: {  /* may be 'listfield' or 'recfield' */
      if (luaX_lookahead(ls) != '=')  /* expression? */
        listfield(ls, cc);
      else
        recfield(ls, cc);
      break;
    }
    case '[': {
      recfield(ls, cc);
      break;
    }
    default: {
      listfield(ls, cc);
      break;
    }
  }
}